

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON__UINT32 __thiscall
ON_WindingNumber::AddBoundary
          (ON_WindingNumber *this,size_t point_count,size_t point_stride,int *boundary_points,
          bool bCloseBoundary)

{
  ON__UINT32 OVar1;
  double dVar2;
  ON__UINT32 OVar3;
  int *piVar4;
  undefined1 local_68 [16];
  int *local_50;
  undefined1 local_48 [16];
  
  OVar1 = this->m_boundary_segment_count;
  OVar3 = OVar1;
  if ((((boundary_points != (int *)0x0) && (1 < point_stride)) && (1 < point_count)) &&
     (!NAN((this->m_winding_point).x))) {
    dVar2 = (double)(int)((ulong)*(undefined8 *)boundary_points >> 0x20);
    local_68._8_4_ = SUB84(dVar2,0);
    local_68._0_8_ = (double)(int)*(undefined8 *)boundary_points;
    local_68._12_4_ = (int)((ulong)dVar2 >> 0x20);
    local_50 = boundary_points;
    for (piVar4 = boundary_points + point_stride;
        piVar4 < boundary_points + point_count * point_stride; piVar4 = piVar4 + point_stride) {
      local_48 = local_68;
      dVar2 = (double)(int)((ulong)*(undefined8 *)piVar4 >> 0x20);
      local_68._8_4_ = SUB84(dVar2,0);
      local_68._0_8_ = (double)(int)*(undefined8 *)piVar4;
      local_68._12_4_ = (int)((ulong)dVar2 >> 0x20);
      Internal_AddBoundarySegment(this,(double *)local_48,(double *)local_68);
    }
    if (bCloseBoundary) {
      dVar2 = (double)(int)((ulong)*(undefined8 *)local_50 >> 0x20);
      local_48._8_4_ = SUB84(dVar2,0);
      local_48._0_8_ = (double)(int)*(undefined8 *)local_50;
      local_48._12_4_ = (int)((ulong)dVar2 >> 0x20);
      Internal_AddBoundarySegment(this,(double *)local_68,(double *)local_48);
    }
    OVar3 = this->m_boundary_segment_count;
  }
  return OVar3 - OVar1;
}

Assistant:

ON__UINT32 ON_WindingNumber::AddBoundary(size_t point_count, size_t point_stride, const int* boundary_points, bool bCloseBoundary)
{
  const ON__UINT32 boundary_segment_count0 = m_boundary_segment_count;
  if (Internal_HaveWindingPoint() && point_count >= 2 && point_stride >= 2 && nullptr != boundary_points)
  {
    ON_2dPoint p0, p1;
    const int* pmax = boundary_points + (point_count*point_stride);
    p1.x = boundary_points[0];
    p1.y = boundary_points[1];
    for (const int* p = boundary_points+point_stride; p < pmax; p += point_stride)
    {
      p0 = p1;
      p1.x = p[0];
      p1.y = p[1];
      Internal_AddBoundarySegment(&p0.x, &p1.x);
    }
    if (bCloseBoundary)
    {
      p0.x = boundary_points[0];
      p0.y = boundary_points[1];
      Internal_AddBoundarySegment(&p1.x, &p0.x);
    }
  }
  return (m_boundary_segment_count - boundary_segment_count0);
}